

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData *
cfd::core::ConfidentialTransaction::GetBitcoinTransaction
          (ByteData *__return_storage_ptr__,ByteData *bitcoin_tx_data,bool is_remove_witness)

{
  CfdException *pCVar1;
  uint32_t flags;
  int ret;
  wally_tx *tx_pointer;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  size_t vsize;
  int local_9c;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  wally_tx *local_78;
  size_t local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  size_t local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  ByteData::GetBytes(&local_48,bitcoin_tx_data);
  local_78 = (wally_tx *)0x0;
  local_9c = wally_tx_from_bytes(local_48.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_48.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_48.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,0,&local_78);
  if (local_9c != 0) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xf7e;
    local_88._M_allocated_capacity = 0x6dab84;
    logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                      "wally_tx_from_bytes NG[{}] ",&local_9c);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"transaction data invalid.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_98);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(__return_storage_ptr__);
  local_70 = 0;
  local_50 = 0;
  local_9c = wally_tx_get_length(local_78,is_remove_witness ^ 1,&local_70);
  if (local_9c != 0) {
    local_98._0_8_ = "cfdcore_elements_transaction.cpp";
    local_98._8_4_ = 0xf89;
    local_88._M_allocated_capacity = 0x6dab84;
    logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                      "wally_tx_get_length NG[{}].",&local_9c);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_98._0_8_ = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"bitcoin tx convert error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_98);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_remove_witness) {
    flags = 0;
  }
  else {
    local_9c = wally_tx_get_vsize(local_78,&local_50);
    if (local_9c != 0) {
      local_98._0_8_ = "cfdcore_elements_transaction.cpp";
      local_98._8_4_ = 0xf8f;
      local_88._M_allocated_capacity = 0x6dab84;
      logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,
                        "wally_tx_get_vsize NG[{}].",&local_9c);
      pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
      local_98._0_8_ = &local_88;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,"bitcoin tx convert error.","");
      CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_98);
      __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    flags = (uint32_t)(local_70 != local_50);
  }
  local_9c = 0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,local_70,(allocator_type *)local_98);
  local_9c = wally_tx_to_bytes(local_78,flags,
                               local_68.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_68.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_68.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,&local_70);
  if (local_9c == 0) {
    if ((long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != local_70) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,local_70);
    }
    ByteData::ByteData((ByteData *)local_98,&local_68);
    ByteData::operator=(__return_storage_ptr__,(ByteData *)local_98);
    if ((pointer)local_98._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity - local_98._0_8_);
    }
    wally_tx_free(local_78);
    local_78 = (wally_tx *)0x0;
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_98._0_8_ = "cfdcore_elements_transaction.cpp";
  local_98._8_4_ = 0xf9a;
  local_88._M_allocated_capacity = 0x6dab84;
  logger::log<int&>((CfdSourceLocation *)local_98,kCfdLogLevelWarning,"wally_tx_to_bytes NG[{}].",
                    &local_9c);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_98._0_8_ = &local_88;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"bitcoin tx convert error.","");
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_98);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData ConfidentialTransaction::GetBitcoinTransaction(
    const ByteData &bitcoin_tx_data, bool is_remove_witness) {
  const std::vector<uint8_t> &byte_data = bitcoin_tx_data.GetBytes();
  struct wally_tx *tx_pointer = NULL;
  int ret =
      wally_tx_from_bytes(byte_data.data(), byte_data.size(), 0, &tx_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_bytes NG[{}] ", ret);
    throw CfdException(kCfdIllegalArgumentError, "transaction data invalid.");
  }

  ByteData result;
  try {
    uint32_t flag = (is_remove_witness) ? 0 : WALLY_TX_FLAG_USE_WITNESS;
    size_t size = 0;
    size_t vsize = 0;
    ret = wally_tx_get_length(tx_pointer, flag, &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_get_length NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (flag != 0) {
      ret = wally_tx_get_vsize(tx_pointer, &vsize);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_get_vsize NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
      }
      if (size == vsize) {
        flag = 0;
      }
    }
    std::vector<uint8_t> buffer(size);
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &size);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
      throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
    }
    if (buffer.size() != size) {
      buffer.resize(size);
    }
    result = ByteData(buffer);
    wally_tx_free(tx_pointer);
    tx_pointer = nullptr;
  } catch (const CfdException &cfd_except) {
    wally_tx_free(tx_pointer);
    throw cfd_except;
  } catch (...) {
    wally_tx_free(tx_pointer);
    warn(CFD_LOG_SOURCE, "unknown exception.");
    throw CfdException(kCfdIllegalStateError, "bitcoin tx convert error.");
  }
  return result;
}